

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

void __thiscall
icu_63::UnifiedCache::_fetch
          (UnifiedCache *this,UHashElement *element,SharedObject **value,UErrorCode *status)

{
  SharedObject *value_00;
  
  *status = *(UErrorCode *)((long)(element->key).pointer + 8);
  removeHardRef(this,*value);
  value_00 = (SharedObject *)(element->value).pointer;
  *value = value_00;
  addHardRef(this,value_00);
  return;
}

Assistant:

void UnifiedCache::_fetch(
        const UHashElement *element,
        const SharedObject *&value,
        UErrorCode &status) const {
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    status = theKey->fCreationStatus;

    // Since we have the cache lock, calling regular SharedObject add/removeRef
    // could cause us to deadlock on ourselves since they may need to lock
    // the cache mutex.
    removeHardRef(value);
    value = static_cast<const SharedObject *>(element->value.pointer);
    addHardRef(value);
}